

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O1

Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> __thiscall
kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::Own<kj::AsyncCapabilityStream>>
          (AsyncStreamFd *this)

{
  UnixEventPort *eventPort;
  PromiseNode *pPVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  ssize_t sVar5;
  AsyncStreamFd *this_00;
  TransformPromiseNodeBase *this_01;
  ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *pIVar6;
  ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *extraout_RDX;
  ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *extraout_RDX_00;
  ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *extraout_RDX_01;
  _func_int **in_RSI;
  AsyncCapabilityStream *pAVar7;
  Own<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_> OVar8;
  Own<kj::_::ChainPromiseNode> OVar9;
  Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> PVar10;
  char c;
  Fault f;
  Fault f_1;
  anon_union_24_2_c6a5a82d anon_var_2;
  iovec iov;
  msghdr msg;
  undefined1 local_e9;
  Own<kj::_::PromiseNode> local_e8;
  Fault local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [8];
  AsyncCapabilityStream *local_c0;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> local_b8;
  Maybe<kj::Own<kj::AsyncCapabilityStream>_> local_a0;
  PromiseFulfiller<void> *local_90;
  int local_88;
  int local_84;
  int local_80;
  iovec local_78;
  msghdr local_68;
  
  local_68.msg_name = (void *)0x0;
  local_68.msg_namelen = 0;
  local_68._12_4_ = 0;
  local_68.msg_flags = 0;
  local_68._52_4_ = 0;
  local_68.msg_iov = &local_78;
  local_78.iov_base = &local_e9;
  local_78.iov_len = 1;
  local_68.msg_iovlen = 1;
  local_68.msg_control = &local_90;
  local_68.msg_controllen = 0x18;
  do {
    sVar5 = recvmsg(*(int *)(in_RSI + 2),&local_68,0x40000000);
    if (-1 < sVar5) {
      iVar4 = 0;
      break;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(true);
  } while (iVar4 == -1);
  if (iVar4 != 0) {
    local_e8.disposer = (Disposer *)0x0;
    local_d8.exception = (Exception *)0x0;
    uStack_d0 = 0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_e8,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_e8);
  }
  if (sVar5 < 0) {
    UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_c8);
    this_01 = (TransformPromiseNodeBase *)operator_new(0x30);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_01,(Own<kj::_::PromiseNode> *)local_c8,
               kj::_::
               TransformPromiseNode<kj::Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++:467:50),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (this_01->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00650db0;
    this_01[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
    local_e8.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>,kj::_::Void,kj::(anonymous_namespace)::AsyncStreamFd::tryReceiveFdImpl<kj::Own<kj::AsyncCapabilityStream>>()::{lambda()#2},kj::_::PropagateException>>
          ::instance;
    local_e8.ptr = (PromiseNode *)this_01;
    OVar9 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_d8,&local_e8);
    pPVar1 = local_e8.ptr;
    pIVar6 = (ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_> *)OVar9.ptr;
    *(undefined4 *)this = local_d8.exception._0_4_;
    *(undefined4 *)(this + 4) = local_d8.exception._4_4_;
    *(undefined4 *)(this + 8) = (undefined4)uStack_d0;
    *(undefined4 *)(this + 0xc) = uStack_d0._4_4_;
    if ((TransformPromiseNodeBase *)local_e8.ptr != (TransformPromiseNodeBase *)0x0) {
      local_e8.ptr = (PromiseNode *)0x0;
      (**(local_e8.disposer)->_vptr_Disposer)
                (local_e8.disposer,
                 ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
                 (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
      pIVar6 = extraout_RDX_00;
    }
    pAVar7 = local_c0;
    if (local_c0 == (AsyncCapabilityStream *)0x0) goto LAB_0048ea09;
    local_c0 = (AsyncCapabilityStream *)0x0;
  }
  else {
    if (sVar5 != 0) {
      if (local_68.msg_controllen < 0x10) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58]>
                  (&local_d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1da,FAILED,"msg.msg_controllen >= sizeof(cmsg)",
                   "\"expected to receive FD over socket; received data instead\"",
                   (char (*) [58])"expected to receive FD over socket; received data instead");
        kj::_::Debug::Fault::fatal(&local_d8);
      }
      if (local_88 != 1) {
        local_e8.disposer = (Disposer *)0x0;
        local_d8.exception = (Exception *)0x0;
        uStack_d0 = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_e8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_e8);
      }
      if (local_84 != 1) {
        local_e8.disposer = (Disposer *)0x0;
        local_d8.exception = (Exception *)0x0;
        uStack_d0 = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_e8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_e8);
      }
      if (local_90 != (PromiseFulfiller<void> *)0x14) {
        local_e8.disposer = (Disposer *)0x0;
        local_d8.exception = (Exception *)0x0;
        uStack_d0 = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_e8,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_e8);
      }
      eventPort = (UnixEventPort *)in_RSI[3];
      this_00 = (AsyncStreamFd *)operator_new(0x90);
      anon_unknown_30::AsyncStreamFd::AsyncStreamFd(this_00,eventPort,local_80,3);
      local_a0.ptr.disposer =
           (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
      local_a0.ptr.ptr = (AsyncCapabilityStream *)this_00;
      OVar8 = heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>,kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>
                        ((kj *)&local_d8,&local_a0);
      pAVar7 = local_a0.ptr.ptr;
      pIVar6 = OVar8.ptr;
      uVar2 = (undefined4)uStack_d0;
      uVar3 = uStack_d0._4_4_;
      uStack_d0 = 0;
      *(undefined4 *)this = local_d8.exception._0_4_;
      *(undefined4 *)(this + 4) = local_d8.exception._4_4_;
      *(undefined4 *)(this + 8) = uVar2;
      *(undefined4 *)(this + 0xc) = uVar3;
      if ((AsyncStreamFd *)local_a0.ptr.ptr != (AsyncStreamFd *)0x0) {
        local_a0.ptr.ptr = (AsyncCapabilityStream *)0x0;
        (**(local_a0.ptr.disposer)->_vptr_Disposer)
                  (local_a0.ptr.disposer,
                   (((AsyncCapabilityStream *)&pAVar7->super_AsyncIoStream)->super_AsyncIoStream).
                   super_AsyncInputStream._vptr_AsyncInputStream[-2] +
                   (long)&(((AsyncCapabilityStream *)&pAVar7->super_AsyncIoStream)->
                          super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream);
        pIVar6 = extraout_RDX;
      }
      goto LAB_0048ea09;
    }
    local_b8.ptr.disposer = (Disposer *)0x0;
    local_b8.ptr.ptr = (AsyncCapabilityStream *)0x0;
    OVar8 = heap<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>,kj::Maybe<kj::Own<kj::AsyncCapabilityStream>>>
                      ((kj *)&local_d8,&local_b8);
    pAVar7 = local_b8.ptr.ptr;
    pIVar6 = OVar8.ptr;
    uVar2 = (undefined4)uStack_d0;
    uVar3 = uStack_d0._4_4_;
    uStack_d0 = 0;
    *(undefined4 *)this = local_d8.exception._0_4_;
    *(undefined4 *)(this + 4) = local_d8.exception._4_4_;
    *(undefined4 *)(this + 8) = uVar2;
    *(undefined4 *)(this + 0xc) = uVar3;
    if (local_b8.ptr.ptr == (AsyncCapabilityStream *)0x0) goto LAB_0048ea09;
    local_b8.ptr.ptr = (AsyncCapabilityStream *)0x0;
    local_c8 = (undefined1  [8])local_b8.ptr.disposer;
  }
  (**(((UnixEventPort *)local_c8)->super_EventPort)._vptr_EventPort)
            (local_c8,(pAVar7->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream
                      [-2] + (long)&pAVar7->super_AsyncIoStream);
  pIVar6 = extraout_RDX_01;
LAB_0048ea09:
  PVar10.super_PromiseBase.node.ptr = (PromiseNode *)pIVar6;
  PVar10.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>)PVar10.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<T>> tryReceiveFdImpl() {
    struct msghdr msg;
    memset(&msg, 0, sizeof(msg));

    struct iovec iov;
    memset(&iov, 0, sizeof(iov));
    char c;
    iov.iov_base = &c;
    iov.iov_len = 1;
    msg.msg_iov = &iov;
    msg.msg_iovlen = 1;

    // Allocate space to receive a cmsg.
    union {
      struct cmsghdr cmsg;
      char cmsgSpace[CMSG_SPACE(sizeof(int))];
    };
    msg.msg_control = &cmsg;
    msg.msg_controllen = sizeof(cmsgSpace);

#ifdef MSG_CMSG_CLOEXEC
    int recvmsgFlags = MSG_CMSG_CLOEXEC;
#else
    int recvmsgFlags = 0;
#endif

    ssize_t n;
    KJ_NONBLOCKING_SYSCALL(n = recvmsg(fd, &msg, recvmsgFlags));
    if (n < 0) {
      return observer.whenBecomesReadable().then([this]() {
        return tryReceiveFdImpl<T>();
      });
    } else if (n == 0) {
      return kj::Maybe<T>(nullptr);
    } else {
      KJ_REQUIRE(msg.msg_controllen >= sizeof(cmsg),
          "expected to receive FD over socket; received data instead");

      // We expect an SCM_RIGHTS message with a single FD.
      KJ_REQUIRE(cmsg.cmsg_level == SOL_SOCKET);
      KJ_REQUIRE(cmsg.cmsg_type == SCM_RIGHTS);
      KJ_REQUIRE(cmsg.cmsg_len == CMSG_LEN(sizeof(int)));

      int receivedFd;
      memcpy(&receivedFd, CMSG_DATA(&cmsg), sizeof(receivedFd));
      return kj::Maybe<T>(wrapFd(receivedFd, (T*)nullptr));
    }
  }